

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O0

Entity_State_PDU * __thiscall
KDIS::PDU::Entity_State_PDU::operator=(Entity_State_PDU *this,Entity_State_PDU *Other)

{
  DeadReckoningCalculator *this_00;
  DeadReckoningCalculator *local_40;
  Entity_State_PDU *Other_local;
  Entity_State_PDU *this_local;
  
  if (this != Other) {
    Header7::operator=(&this->super_Header,&Other->super_Header);
    DATA_TYPE::EntityIdentifier::operator=(&this->m_EntityID,&Other->m_EntityID);
    this->m_ui8ForceID = Other->m_ui8ForceID;
    this->m_ui8NumOfVariableParams = Other->m_ui8NumOfVariableParams;
    DATA_TYPE::EntityType::operator=(&this->m_EntityType,&Other->m_EntityType);
    DATA_TYPE::EntityType::operator=(&this->m_AltEntityType,&Other->m_AltEntityType);
    DATA_TYPE::Vector::operator=(&this->m_EntityLinearVelocity,&Other->m_EntityLinearVelocity);
    DATA_TYPE::WorldCoordinates::operator=(&this->m_EntityLocation,&Other->m_EntityLocation);
    DATA_TYPE::EulerAngles::operator=(&this->m_EntityOrientation,&Other->m_EntityOrientation);
    DATA_TYPE::EntityAppearance::operator=(&this->m_EntityAppearance,&Other->m_EntityAppearance);
    DATA_TYPE::DeadReckoningParameter::operator=
              (&this->m_DeadReckoningParameter,&Other->m_DeadReckoningParameter);
    DATA_TYPE::EntityMarking::operator=(&this->m_EntityMarking,&Other->m_EntityMarking);
    DATA_TYPE::EntityCapabilities::operator=
              (&this->m_EntityCapabilities,&Other->m_EntityCapabilities);
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
    ::operator=(&this->m_vVariableParameters,&Other->m_vVariableParameters);
    if (((this->m_pDrCalc != (DeadReckoningCalculator *)0x0) &&
        (this->m_pDrCalc != Other->m_pDrCalc)) &&
       (this_00 = this->m_pDrCalc, this_00 != (DeadReckoningCalculator *)0x0)) {
      UTILS::DeadReckoningCalculator::~DeadReckoningCalculator(this_00);
      operator_delete(this_00,0x170);
    }
    if (Other->m_pDrCalc == (DeadReckoningCalculator *)0x0) {
      local_40 = (DeadReckoningCalculator *)0x0;
    }
    else {
      local_40 = (DeadReckoningCalculator *)operator_new(0x170);
      UTILS::DeadReckoningCalculator::DeadReckoningCalculator(local_40,Other->m_pDrCalc);
    }
    this->m_pDrCalc = local_40;
  }
  return this;
}

Assistant:

Entity_State_PDU & Entity_State_PDU::operator=( const Entity_State_PDU & Other )
{
    if(this != &Other) {
        Header::operator=(Other);
        m_EntityID = Other.m_EntityID;
        m_ui8ForceID = Other.m_ui8ForceID;
        m_ui8NumOfVariableParams = Other.m_ui8NumOfVariableParams;
        m_EntityType = Other.m_EntityType;
        m_AltEntityType = Other.m_AltEntityType;
        m_EntityLinearVelocity = Other.m_EntityLinearVelocity;
        m_EntityLocation = Other.m_EntityLocation;
        m_EntityOrientation = Other.m_EntityOrientation;
        m_EntityAppearance = Other.m_EntityAppearance;
        m_DeadReckoningParameter = Other.m_DeadReckoningParameter;
        m_EntityMarking = Other.m_EntityMarking;
        m_EntityCapabilities = Other.m_EntityCapabilities;
        m_vVariableParameters = Other.m_vVariableParameters;

        if (m_pDrCalc && m_pDrCalc != Other.m_pDrCalc)
            delete m_pDrCalc;
        m_pDrCalc = (Other.m_pDrCalc ? new DeadReckoningCalculator(*Other.m_pDrCalc) : NULL);
    }
    return *this;
}